

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

int parseHeaderName(QByteArrayView headerName)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  qsizetype qVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  QByteArrayView what;
  QByteArrayView what_00;
  QByteArrayView what_01;
  QByteArrayView what_02;
  QByteArrayView what_03;
  QByteArrayView what_04;
  QByteArrayView what_05;
  QByteArrayView what_06;
  QByteArrayView what_07;
  QByteArrayView what_08;
  QByteArrayView what_09;
  QByteArrayView what_10;
  QByteArrayView what_11;
  anon_class_16_1_13540c76 local_20;
  long local_10;
  
  pcVar6 = headerName.m_data;
  lVar7 = headerName.m_size;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar7 != 0) {
    uVar2 = (uint)*pcVar6;
    uVar5 = uVar2 + 0x20 & 0xff;
    if (0x19 < uVar2 - 0x41) {
      uVar5 = uVar2;
    }
    uVar5 = uVar5 & 0xff;
    local_20.headerName.m_size = lVar7;
    local_20.headerName.m_data = pcVar6;
    switch(uVar5) {
    case 99:
      qVar4 = QByteArrayView::lengthHelperCharArray("content-type",0xd);
      what.m_data = "content-type";
      what.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what);
      iVar3 = 0;
      if (bVar1) goto LAB_00193c57;
      qVar4 = QByteArrayView::lengthHelperCharArray("content-length",0xf);
      what_00.m_data = "content-length";
      what_00.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_00);
      if (bVar1) {
        iVar3 = 1;
        goto LAB_00193c57;
      }
      qVar4 = QByteArrayView::lengthHelperCharArray("cookie",7);
      what_09.m_data = "cookie";
      what_09.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_09);
      if (bVar1) {
        iVar3 = 4;
        goto LAB_00193c57;
      }
      qVar4 = QByteArrayView::lengthHelperCharArray("content-disposition",0x14);
      what_11.m_data = "content-disposition";
      what_11.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_11);
      if (bVar1) {
        iVar3 = 6;
        goto LAB_00193c57;
      }
      break;
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      break;
    case 0x65:
      qVar4 = QByteArrayView::lengthHelperCharArray("etag",5);
      what_03.m_data = "etag";
      what_03.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_03);
      if (bVar1) {
        iVar3 = 10;
        goto LAB_00193c57;
      }
      break;
    case 0x69:
      qVar4 = QByteArrayView::lengthHelperCharArray("if-modified-since",0x12);
      what_04.m_data = "if-modified-since";
      what_04.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_04);
      if (bVar1) {
        iVar3 = 9;
        goto LAB_00193c57;
      }
      qVar4 = QByteArrayView::lengthHelperCharArray("if-match",9);
      what_07.m_data = "if-match";
      what_07.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_07);
      if (bVar1) {
        iVar3 = 0xb;
        goto LAB_00193c57;
      }
      qVar4 = QByteArrayView::lengthHelperCharArray("if-none-match",0xe);
      what_10.m_data = "if-none-match";
      what_10.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_10);
      if (bVar1) {
        iVar3 = 0xc;
        goto LAB_00193c57;
      }
      break;
    case 0x6c:
      qVar4 = QByteArrayView::lengthHelperCharArray("location",9);
      what_02.m_data = "location";
      what_02.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_02);
      if (bVar1) {
        iVar3 = 2;
        goto LAB_00193c57;
      }
      qVar4 = QByteArrayView::lengthHelperCharArray("last-modified",0xe);
      what_06.m_data = "last-modified";
      what_06.m_size = qVar4;
      bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_06);
      if (bVar1) {
        iVar3 = 3;
        goto LAB_00193c57;
      }
      break;
    default:
      if (uVar5 == 0x73) {
        qVar4 = QByteArrayView::lengthHelperCharArray("set-cookie",0xb);
        what_05.m_data = "set-cookie";
        what_05.m_size = qVar4;
        bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_05);
        if (bVar1) {
          iVar3 = 5;
          goto LAB_00193c57;
        }
        qVar4 = QByteArrayView::lengthHelperCharArray("server",7);
        what_08.m_data = "server";
        what_08.m_size = qVar4;
        bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_08);
        if (bVar1) {
          iVar3 = 8;
          goto LAB_00193c57;
        }
      }
      else if (uVar5 == 0x75) {
        qVar4 = QByteArrayView::lengthHelperCharArray("user-agent",0xb);
        what_01.m_data = "user-agent";
        what_01.m_size = qVar4;
        bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(&local_20,what_01);
        if (bVar1) {
          iVar3 = 7;
          goto LAB_00193c57;
        }
      }
    }
  }
  iVar3 = -1;
LAB_00193c57:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int parseHeaderName(QByteArrayView headerName)
{
    if (headerName.isEmpty())
        return -1;

    auto is = [headerName](QByteArrayView what) {
        return headerName.compare(what, Qt::CaseInsensitive) == 0;
    };

    switch (QtMiscUtils::toAsciiLower(headerName.front())) {
    case 'c':
        if (is("content-type"))
            return QNetworkRequest::ContentTypeHeader;
        else if (is("content-length"))
            return QNetworkRequest::ContentLengthHeader;
        else if (is("cookie"))
            return QNetworkRequest::CookieHeader;
        else if (is("content-disposition"))
            return QNetworkRequest::ContentDispositionHeader;
        break;

    case 'e':
        if (is("etag"))
            return QNetworkRequest::ETagHeader;
        break;

    case 'i':
        if (is("if-modified-since"))
            return QNetworkRequest::IfModifiedSinceHeader;
        if (is("if-match"))
            return QNetworkRequest::IfMatchHeader;
        if (is("if-none-match"))
            return QNetworkRequest::IfNoneMatchHeader;
        break;

    case 'l':
        if (is("location"))
            return QNetworkRequest::LocationHeader;
        else if (is("last-modified"))
            return QNetworkRequest::LastModifiedHeader;
        break;

    case 's':
        if (is("set-cookie"))
            return QNetworkRequest::SetCookieHeader;
        else if (is("server"))
            return QNetworkRequest::ServerHeader;
        break;

    case 'u':
        if (is("user-agent"))
            return QNetworkRequest::UserAgentHeader;
        break;
    }

    return -1; // nothing found
}